

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

void __thiscall sjtu::trainType::display(trainType *this,timeType *date)

{
  int iVar1;
  int iVar2;
  void *this_00;
  ostream *poVar3;
  timeType *in_RSI;
  char *in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  timeType *in_stack_00000010;
  int in_stack_0000001c;
  trainType *in_stack_00000020;
  int day_id;
  
  iVar1 = timeType::dateminus(in_RSI,(timeType *)(in_RDI + 0xa768));
  if ((-1 < iVar1) &&
     (iVar2 = timeType::dateminus((timeType *)(in_RDI + 0xa778),(timeType *)(in_RDI + 0xa768)),
     iVar1 <= iVar2)) {
    poVar3 = std::operator<<((ostream *)&std::cout,in_RDI);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,in_RDI[0xa798]);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    display_single(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_0000000c,
                   in_stack_00000008);
    return;
  }
  this_00 = (void *)std::ostream::operator<<(&std::cout,-1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void display(timeType date)
		{
			int day_id = timeType::dateminus(date , saleDate[0]);
			if (day_id < 0 || day_id > timeType::dateminus(saleDate[1] , saleDate[0])) std::cout << -1 << std::endl;
			else
			{
				std::cout << trainID << " " << type << std::endl;
				display_single(day_id , date , 0 , stationNum);
			}
		}